

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_2cfb1b::CommandTask::inputsAvailable(CommandTask *this,TaskInterface ti)

{
  QueueJobContext QVar1;
  int iVar2;
  TaskInterface ti_local;
  anon_class_24_2_e88081f0 fn;
  _Any_data local_60;
  code *local_50;
  code *local_48;
  DetachedContext ctx;
  _Any_data local_38;
  _Manager_type local_28;
  
  ti_local.ctx = ti.ctx;
  ti_local.impl = ti.impl;
  fn.this = this;
  fn.ti.impl = ti_local.impl;
  fn.ti.ctx = ti_local.ctx;
  iVar2 = (*(this->command->super_JobDescriptor)._vptr_JobDescriptor[0x13])();
  if ((char)iVar2 == '\0') {
    QVar1._vptr_QueueJobContext = (_func_int **)this->command;
    local_60._8_8_ = 0;
    local_60._M_unused._M_object = operator_new(0x18);
    *(CommandTask **)local_60._M_unused._0_8_ = fn.this;
    *(void **)((long)local_60._M_unused._0_8_ + 8) = fn.ti.impl;
    *(void **)((long)local_60._M_unused._0_8_ + 0x10) = fn.ti.ctx;
    local_48 = std::
               _Function_handler<void_(llbuild::basic::QueueJobContext_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1561:15)>
               ::_M_invoke;
    local_50 = std::
               _Function_handler<void_(llbuild::basic::QueueJobContext_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1561:15)>
               ::_M_manager;
    ctx.super_QueueJobContext._vptr_QueueJobContext =
         (QueueJobContext)(QueueJobContext)QVar1._vptr_QueueJobContext;
    std::function<void_(llbuild::basic::QueueJobContext_*)>::function
              ((function<void_(llbuild::basic::QueueJobContext_*)> *)&local_38,
               (function<void_(llbuild::basic::QueueJobContext_*)> *)&local_60);
    llbuild::core::TaskInterface::spawn(&ti_local,(QueueJob *)&ctx,Normal);
    if (local_28 != (_Manager_type)0x0) {
      (*local_28)(&local_38,&local_38,__destroy_functor);
    }
    if (local_50 != (code *)0x0) {
      (*local_50)(&local_60,&local_60,__destroy_functor);
    }
  }
  else {
    ctx.super_QueueJobContext._vptr_QueueJobContext =
         (QueueJobContext)&PTR__QueueJobContext_0022d4d0;
    inputsAvailable::anon_class_24_2_e88081f0::operator()(&fn,&ctx.super_QueueJobContext);
    llbuild::basic::QueueJobContext::~QueueJobContext(&ctx.super_QueueJobContext);
  }
  return;
}

Assistant:

virtual void inputsAvailable(TaskInterface ti) override {
    auto fn = [this, ti](QueueJobContext* context) mutable {
      // If the build should cancel, do nothing.
      if (ti.isCancelled()) {
        ti.complete(BuildValue::makeCancelledCommand().toData());
        return;
      }

      // Check if the command should be skipped.
      if (!getBuildSystem(ti).getDelegate().shouldCommandStart(&command)) {
        // We need to call commandFinished here because commandPreparing and
        // shouldCommandStart guarantee that they're followed by
        // commandFinished.
        getBuildSystem(ti).getDelegate().commandFinished(&command, ProcessStatus::Skipped);
        ti.complete(BuildValue::makeSkippedCommand().toData());
        return;
      }
    
      // Execute the command, with notifications to the delegate.
      command.execute(getBuildSystem(ti).getBuildSystem(), ti, context, [ti](BuildValue&& result) mutable {
        // Inform the engine of the result.
        if (result.isFailedCommand()) {
          getBuildSystem(ti).getDelegate().hadCommandFailure();
        }
        ti.complete(result.toData());
      });
    };
    if (command.isDetached()) {
      struct DetachedContext: public QueueJobContext {
        unsigned laneID() const override { return -1; }
      };
      DetachedContext ctx;
      fn(&ctx);
    } else {
      ti.spawn({ &command, std::move(fn) });
    }
  }